

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# banman.cpp
# Opt level: O3

void __thiscall BanMan::DumpBanlist(BanMan *this)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  Logger *this_00;
  long lVar4;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  long local_78;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock2;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock1;
  banmap_t banmap;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (DumpBanlist()::dump_mutex == '\0') {
    DumpBanlist();
  }
  criticalblock1.super_unique_lock._M_device = &DumpBanlist::dump_mutex.super_mutex;
  criticalblock1.super_unique_lock._M_owns = false;
  std::unique_lock<std::mutex>::lock(&criticalblock1.super_unique_lock);
  banmap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &banmap._M_t._M_impl.super__Rb_tree_header._M_header;
  banmap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  banmap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  banmap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  criticalblock2.super_unique_lock._M_owns = false;
  criticalblock2.super_unique_lock._M_device = (mutex_type *)this;
  banmap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       banmap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::unique_lock<std::mutex>::lock(&criticalblock2.super_unique_lock);
  SweepBanned(this);
  if (this->m_is_dirty == false) {
    std::unique_lock<std::mutex>::~unique_lock(&criticalblock2.super_unique_lock);
  }
  else {
    std::
    _Rb_tree<CSubNet,_std::pair<const_CSubNet,_CBanEntry>,_std::_Select1st<std::pair<const_CSubNet,_CBanEntry>_>,_std::less<CSubNet>,_std::allocator<std::pair<const_CSubNet,_CBanEntry>_>_>
    ::operator=(&banmap._M_t,&(this->m_banned)._M_t);
    this->m_is_dirty = false;
    std::unique_lock<std::mutex>::~unique_lock(&criticalblock2.super_unique_lock);
    lVar3 = std::chrono::_V2::steady_clock::now();
    bVar2 = CBanDB::Write(&this->m_ban_db,&banmap);
    if (!bVar2) {
      criticalblock2.super_unique_lock._M_owns = false;
      criticalblock2.super_unique_lock._M_device = (mutex_type *)this;
      std::unique_lock<std::mutex>::lock(&criticalblock2.super_unique_lock);
      this->m_is_dirty = true;
      std::unique_lock<std::mutex>::~unique_lock(&criticalblock2.super_unique_lock);
    }
    this_00 = LogInstance();
    bVar2 = BCLog::Logger::WillLogCategoryLevel(this_00,NET,Debug);
    if (bVar2) {
      criticalblock2.super_unique_lock._M_device =
           (mutex_type *)banmap._M_t._M_impl.super__Rb_tree_header._M_node_count;
      lVar4 = std::chrono::_V2::steady_clock::now();
      local_78 = (lVar4 - lVar3) / 1000000;
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/banman.cpp"
      ;
      source_file._M_len = 0x5a;
      logging_function._M_str = "DumpBanlist";
      logging_function._M_len = 0xb;
      LogPrintFormatInternal<unsigned_long,long>
                (logging_function,source_file,0x45,NET,Debug,(ConstevalFormatString<2U>)0xf6d815,
                 (unsigned_long *)&criticalblock2.super_unique_lock,&local_78);
    }
  }
  std::
  _Rb_tree<CSubNet,_std::pair<const_CSubNet,_CBanEntry>,_std::_Select1st<std::pair<const_CSubNet,_CBanEntry>_>,_std::less<CSubNet>,_std::allocator<std::pair<const_CSubNet,_CBanEntry>_>_>
  ::~_Rb_tree(&banmap._M_t);
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock1.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void BanMan::DumpBanlist()
{
    static Mutex dump_mutex;
    LOCK(dump_mutex);

    banmap_t banmap;
    {
        LOCK(m_banned_mutex);
        SweepBanned();
        if (!m_is_dirty) return;
        banmap = m_banned;
        m_is_dirty = false;
    }

    const auto start{SteadyClock::now()};
    if (!m_ban_db.Write(banmap)) {
        LOCK(m_banned_mutex);
        m_is_dirty = true;
    }

    LogDebug(BCLog::NET, "Flushed %d banned node addresses/subnets to disk  %dms\n", banmap.size(),
             Ticks<std::chrono::milliseconds>(SteadyClock::now() - start));
}